

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::IsStringOrMessage(FieldDescriptor *field)

{
  CppType CVar1;
  LogMessage *pLVar2;
  LogMessage local_30;
  Voidify local_19;
  FieldDescriptor *local_18;
  FieldDescriptor *field_local;
  
  local_18 = field;
  CVar1 = FieldDescriptor::cpp_type(field);
  if (CVar1 - CPPTYPE_INT32 < 8) {
    field_local._7_1_ = false;
  }
  else {
    if (1 < CVar1 - CPPTYPE_STRING) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/helpers.cc"
                 ,0x54c);
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar2,(char (*) [16])"Can\'t get here.");
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar2);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_30);
    }
    field_local._7_1_ = true;
  }
  return field_local._7_1_;
}

Assistant:

bool IsStringOrMessage(const FieldDescriptor* field) {
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
    case FieldDescriptor::CPPTYPE_INT64:
    case FieldDescriptor::CPPTYPE_UINT32:
    case FieldDescriptor::CPPTYPE_UINT64:
    case FieldDescriptor::CPPTYPE_DOUBLE:
    case FieldDescriptor::CPPTYPE_FLOAT:
    case FieldDescriptor::CPPTYPE_BOOL:
    case FieldDescriptor::CPPTYPE_ENUM:
      return false;
    case FieldDescriptor::CPPTYPE_STRING:
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return true;
  }

  ABSL_LOG(FATAL) << "Can't get here.";
  return false;
}